

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSuite.cpp
# Opt level: O3

vector<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_> * __thiscall
Test::Suite::listTests
          (vector<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_>
           *__return_storage_ptr__,Suite *this)

{
  pointer psVar1;
  _Alloc_hider _Var2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  pointer pTVar4;
  pointer psVar5;
  pointer __str_00;
  undefined1 auVar6 [8];
  vector<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_> tmp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  undefined1 local_a8 [8];
  _Alloc_hider local_a0;
  Suite *local_80;
  pointer local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->
  super__Vector_base<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_>::reserve
            (__return_storage_ptr__,
             ((long)(this->testMethods).
                    super__Vector_base<Test::Suite::TestMethod,_std::allocator<Test::Suite::TestMethod>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->testMethods).
                    super__Vector_base<Test::Suite::TestMethod,_std::allocator<Test::Suite::TestMethod>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555);
  pTVar4 = (this->testMethods).
           super__Vector_base<Test::Suite::TestMethod,_std::allocator<Test::Suite::TestMethod>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_78 = (this->testMethods).
             super__Vector_base<Test::Suite::TestMethod,_std::allocator<Test::Suite::TestMethod>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  local_80 = this;
  if (pTVar4 != local_78) {
    __str_00 = pTVar4;
    do {
      local_a8 = (undefined1  [8])pTVar4;
      std::__cxx11::string::string((string *)&local_70,&__str_00->name);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&local_70,"(");
      pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               _M_append(&local_70,(__str_00->argString)._M_dataplus._M_p,
                         (__str_00->argString)._M_string_length);
      std::__cxx11::string::string((string *)&local_50,pbVar3);
      pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_50,")");
      std::__cxx11::string::string((string *)&local_a0,pbVar3);
      std::vector<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_>::
      emplace_back<Test::TestMethodInfo>(__return_storage_ptr__,(TestMethodInfo *)local_a8);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      __str_00 = __str_00 + 1;
      pTVar4 = pTVar4 + 1;
    } while (__str_00 != local_78);
  }
  psVar1 = (local_80->subSuites).
           super__Vector_base<std::shared_ptr<Test::Suite>,_std::allocator<std::shared_ptr<Test::Suite>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar5 = (local_80->subSuites).
                super__Vector_base<std::shared_ptr<Test::Suite>,_std::allocator<std::shared_ptr<Test::Suite>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar5 != psVar1; psVar5 = psVar5 + 1) {
    (*((psVar5->super___shared_ptr<Test::Suite,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->_vptr_Suite[4]
    )(local_a8);
    std::vector<Test::TestMethodInfo,std::allocator<Test::TestMethodInfo>>::
    _M_range_insert<std::move_iterator<__gnu_cxx::__normal_iterator<Test::TestMethodInfo*,std::vector<Test::TestMethodInfo,std::allocator<Test::TestMethodInfo>>>>>
              ((vector<Test::TestMethodInfo,std::allocator<Test::TestMethodInfo>> *)
               __return_storage_ptr__,
               (__return_storage_ptr__->
               super__Vector_base<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_>).
               _M_impl.super__Vector_impl_data._M_finish,local_a8,local_a0._M_p);
    _Var2._M_p = local_a0._M_p;
    for (auVar6 = local_a8; auVar6 != (undefined1  [8])_Var2._M_p;
        auVar6 = (undefined1  [8])
                 ((((pointer)auVar6)->functor).super__Function_base._M_functor._M_pod_data + 8)) {
      std::__cxx11::string::~string((string *)&(((pointer)auVar6)->name)._M_string_length);
    }
    if (local_a8 != (undefined1  [8])0x0) {
      operator_delete((void *)local_a8);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<TestMethodInfo> Suite::listTests() const {
  std::vector<TestMethodInfo> result;
  result.reserve(testMethods.size());
  for (const auto &method : testMethods) {
    result.emplace_back(
        TestMethodInfo{reinterpret_cast<std::uintptr_t>(&method), method.name + "(" + method.argString + ")"});
  }
  for (const auto &suite : subSuites) {
    auto tmp = suite->listTests();
    result.insert(result.end(), std::make_move_iterator(tmp.begin()), std::make_move_iterator(tmp.end()));
  }
  return result;
}